

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O1

void __thiscall CVmVarHeapHybrid::CVmVarHeapHybrid(CVmVarHeapHybrid *this,CVmObjTable *objtab)

{
  CVmVarHeapHybrid_head **ppCVar1;
  CVmVarHeapHybrid_head *pCVar2;
  CVmVarHeapHybrid_malloc *pCVar3;
  
  (this->super_CVmVarHeap)._vptr_CVmVarHeap = (_func_int **)&PTR__CVmVarHeapHybrid_0032c710;
  this->objtab_ = objtab;
  this->cell_heap_cnt_ = 5;
  ppCVar1 = (CVmVarHeapHybrid_head **)malloc(0x28);
  this->cell_heaps_ = ppCVar1;
  if (ppCVar1 != (CVmVarHeapHybrid_head **)0x0) {
    pCVar2 = (CVmVarHeapHybrid_head *)operator_new(0x28);
    (pCVar2->super_CVmVarHeapHybrid_block)._vptr_CVmVarHeapHybrid_block =
         (_func_int **)&PTR__CVmVarHeapHybrid_block_0032c7d8;
    pCVar2->mem_mgr_ = this;
    pCVar2->cell_size_ = 0x20;
    pCVar2->page_count_ = 0x352;
    pCVar2->first_free_ = (void *)0x0;
    *ppCVar1 = pCVar2;
    pCVar2 = (CVmVarHeapHybrid_head *)operator_new(0x28);
    (pCVar2->super_CVmVarHeapHybrid_block)._vptr_CVmVarHeapHybrid_block =
         (_func_int **)&PTR__CVmVarHeapHybrid_block_0032c7d8;
    pCVar2->mem_mgr_ = this;
    pCVar2->cell_size_ = 0x40;
    pCVar2->page_count_ = 400;
    pCVar2->first_free_ = (void *)0x0;
    ppCVar1[1] = pCVar2;
    pCVar2 = (CVmVarHeapHybrid_head *)operator_new(0x28);
    (pCVar2->super_CVmVarHeapHybrid_block)._vptr_CVmVarHeapHybrid_block =
         (_func_int **)&PTR__CVmVarHeapHybrid_block_0032c7d8;
    pCVar2->mem_mgr_ = this;
    pCVar2->cell_size_ = 0x80;
    pCVar2->page_count_ = 200;
    pCVar2->first_free_ = (void *)0x0;
    ppCVar1[2] = pCVar2;
    pCVar2 = (CVmVarHeapHybrid_head *)operator_new(0x28);
    (pCVar2->super_CVmVarHeapHybrid_block)._vptr_CVmVarHeapHybrid_block =
         (_func_int **)&PTR__CVmVarHeapHybrid_block_0032c7d8;
    pCVar2->mem_mgr_ = this;
    pCVar2->cell_size_ = 0x100;
    pCVar2->page_count_ = 100;
    pCVar2->first_free_ = (void *)0x0;
    ppCVar1[3] = pCVar2;
    pCVar2 = (CVmVarHeapHybrid_head *)operator_new(0x28);
    (pCVar2->super_CVmVarHeapHybrid_block)._vptr_CVmVarHeapHybrid_block =
         (_func_int **)&PTR__CVmVarHeapHybrid_block_0032c7d8;
    pCVar2->mem_mgr_ = this;
    pCVar2->cell_size_ = 0x200;
    pCVar2->page_count_ = 0x32;
    pCVar2->first_free_ = (void *)0x0;
    ppCVar1[4] = pCVar2;
    pCVar3 = (CVmVarHeapHybrid_malloc *)operator_new(8);
    (pCVar3->super_CVmVarHeapHybrid_block)._vptr_CVmVarHeapHybrid_block =
         (_func_int **)&PTR__CVmVarHeapHybrid_block_0032cd28;
    this->malloc_heap_ = pCVar3;
    this->first_array_ = (CVmVarHeapHybrid_array *)0x0;
    return;
  }
  err_throw(0xca);
}

Assistant:

CVmVarHeapHybrid::CVmVarHeapHybrid(CVmObjTable *objtab)
{
    /* remember my object table */
    objtab_ = objtab;

    /* set the cell heap count */
    cell_heap_cnt_ = 5;

    /* allocate our cell heap pointer array */
    cell_heaps_ = (CVmVarHeapHybrid_head **)
                  t3malloc(cell_heap_cnt_ * sizeof(CVmVarHeapHybrid_head *));

    /* if that failed, throw an error */
    if (cell_heaps_ == 0)
        err_throw(VMERR_OUT_OF_MEMORY);

    /* 
     *   Allocate our cell heaps.  Set up the heaps so that the pages run
     *   about 32k each.  
     */
    cell_heaps_[0] = new CVmVarHeapHybrid_head(this, 32, 850);
    cell_heaps_[1] = new CVmVarHeapHybrid_head(this, 64, 400);
    cell_heaps_[2] = new CVmVarHeapHybrid_head(this, 128, 200);
    cell_heaps_[3] = new CVmVarHeapHybrid_head(this, 256, 100);
    cell_heaps_[4] = new CVmVarHeapHybrid_head(this, 512, 50);

    /* allocate our malloc heap manager */
    malloc_heap_ = new CVmVarHeapHybrid_malloc();

    /* we haven't allocated any cell array pages yet */
    first_array_ = 0;
}